

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtered_re2.cc
# Opt level: O0

void __thiscall
re2::FilteredRE2::Compile
          (FilteredRE2 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *atoms)

{
  size_type sVar1;
  ostream *poVar2;
  Prefilter *pPVar3;
  reference ppRVar4;
  Prefilter *prefilter;
  size_t i;
  LogMessage local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *atoms_local;
  FilteredRE2 *this_local;
  
  local_18 = atoms;
  atoms_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this;
  if (((this->compiled_ & 1U) == 0) &&
     (sVar1 = std::vector<re2::RE2_*,_std::allocator<re2::RE2_*>_>::size(&this->re2_vec_),
     sVar1 != 0)) {
    for (prefilter = (Prefilter *)0x0;
        pPVar3 = (Prefilter *)
                 std::vector<re2::RE2_*,_std::allocator<re2::RE2_*>_>::size(&this->re2_vec_),
        prefilter < pPVar3; prefilter = (Prefilter *)((long)&prefilter->op_ + 1)) {
      ppRVar4 = std::vector<re2::RE2_*,_std::allocator<re2::RE2_*>_>::operator[]
                          (&this->re2_vec_,(size_type)prefilter);
      pPVar3 = Prefilter::FromRE2(*ppRVar4);
      PrefilterTree::Add(this->prefilter_tree_,pPVar3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(local_18);
    PrefilterTree::Compile(this->prefilter_tree_,local_18);
    this->compiled_ = true;
    return;
  }
  LogMessage::LogMessage
            (&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/filtered_re2.cc",
             0x2d,0);
  poVar2 = LogMessage::stream(&local_198);
  poVar2 = std::operator<<(poVar2,"C: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(this->compiled_ & 1));
  poVar2 = std::operator<<(poVar2," S:");
  sVar1 = std::vector<re2::RE2_*,_std::allocator<re2::RE2_*>_>::size(&this->re2_vec_);
  std::ostream::operator<<(poVar2,sVar1);
  LogMessage::~LogMessage(&local_198);
  return;
}

Assistant:

void FilteredRE2::Compile(vector<string>* atoms) {
  if (compiled_ || re2_vec_.size() == 0) {
    LOG(INFO) << "C: " << compiled_ << " S:" << re2_vec_.size();
    return;
  }

  for (size_t i = 0; i < re2_vec_.size(); i++) {
    Prefilter* prefilter = Prefilter::FromRE2(re2_vec_[i]);
    prefilter_tree_->Add(prefilter);
  }
  atoms->clear();
  prefilter_tree_->Compile(atoms);
  compiled_ = true;
}